

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O2

MPP_RET hal_vp8e_setup(void *hal)

{
  MppBuffer *buffer;
  undefined8 *puVar1;
  MppFrameFormat format;
  MppBufferGroup *group;
  undefined2 uVar2;
  RK_U32 RVar3;
  MPP_RET MVar4;
  long lVar5;
  undefined1 *puVar6;
  void *pvVar7;
  undefined4 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int *piVar18;
  uint uVar19;
  MppBufferGroup *buffer_00;
  long lVar20;
  undefined8 uVar21;
  undefined8 local_68;
  VepuFormatCfg fmt_cfg;
  
  lVar5 = *(long *)((long)hal + 0x70);
  uVar15 = *(uint *)(lVar5 + 0xc);
  uVar10 = *(uint *)(lVar5 + 0x10);
  if (*(int *)(lVar5 + 0x58) != 0) {
    _mpp_log_l(2,"hal_vp8e_base","Warning: do not support mirroring\n","set_parameter");
  }
  uVar13 = uVar15 + 0xf & 0xfffffff0;
  uVar19 = uVar10 + 0xf & 0xfffffff0;
  iVar9 = *(int *)(lVar5 + 0x50);
  if (iVar9 == 0) {
LAB_0025c0a2:
    uVar8 = 0;
    uVar17 = uVar15;
    uVar14 = uVar13;
    uVar13 = uVar19;
    uVar15 = uVar10;
  }
  else {
    uVar17 = uVar10;
    uVar14 = uVar19;
    if (iVar9 == 1) {
      uVar8 = 1;
    }
    else {
      if (iVar9 != 3) {
        _mpp_log_l(2,"hal_vp8e_base",
                   "Warning: only support 90 or 270 degree rotate, request rotate %d",
                   "set_parameter",0);
        goto LAB_0025c0a2;
      }
      uVar8 = 2;
    }
  }
  RVar3 = get_vepu_pixel_stride
                    ((VepuStrideCfg *)((long)hal + 0x6934),uVar17,*(RK_U32 *)(lVar5 + 0x14),
                     *(MppFrameFormat *)(lVar5 + 0x24));
  iVar9 = (int)uVar14 >> 4;
  *(int *)((long)hal + 0x6928) = (int)(iVar9 * uVar13) >> 4;
  *(int *)((long)hal + 0x692c) = iVar9;
  iVar11 = (int)uVar13 >> 4;
  *(int *)((long)hal + 0x6930) = iVar11;
  *(uint *)((long)hal + 0x80) = uVar14;
  *(uint *)((long)hal + 0x84) = uVar13;
  *(int *)((long)hal + 0x78) = iVar9;
  *(int *)((long)hal + 0x7c) = iVar11;
  *(undefined8 *)((long)hal + 0x88) = 0;
  *(undefined8 *)((long)hal + 0x90) = 0;
  *(undefined4 *)((long)hal + 0x98) = 0;
  *(undefined8 *)((long)hal + 0x9c) = 0x100000003;
  *(undefined8 *)((long)hal + 0xa4) = 0;
  *(undefined4 *)((long)hal + 0xac) = 0;
  *(undefined4 *)((long)hal + 200) = 1;
  *(undefined8 *)((long)hal + 0xb0) = 0x100000001;
  *(undefined4 *)((long)hal + 0x110) = 1;
  *(undefined8 *)((long)hal + 0xb8) = 0;
  *(undefined8 *)((long)hal + 0xc0) = 0x100000000;
  *(undefined1 *)((long)hal + 0xcc) = 1;
  *(undefined8 *)((long)hal + 0xf0) = 0;
  *(undefined8 *)((long)hal + 0xf8) = 0;
  *(undefined8 *)((long)hal + 0xd0) = 0;
  *(undefined8 *)((long)hal + 0xd8) = 0;
  *(undefined4 *)((long)hal + 400) = uVar8;
  format = *(MppFrameFormat *)(lVar5 + 0x24);
  if ((format & ~MPP_FMT_YUV420P) == MPP_FMT_YUV420SP) {
    *(undefined4 *)((long)hal + 0x2f8) = 0;
LAB_0025c199:
    *(undefined4 *)((long)hal + 0x2fc) = 0;
  }
  else {
    *(undefined4 *)((long)hal + 0x2f8) = 0;
    if (format - MPP_FMT_RGB565 < 6) goto LAB_0025c199;
  }
  *(int *)((long)hal + 0x168) = iVar9;
  *(int *)((long)hal + 0x164) = iVar11;
  *(RK_U32 *)((long)hal + 0x178) = RVar3;
  uVar10 = 0x10 - (uVar17 & 0xf) >> 2;
  if ((uVar17 & 0xf) == 0) {
    uVar10 = 0;
  }
  *(uint *)((long)hal + 0x17c) = uVar10;
  iVar9 = 0x10 - (uVar15 & 0xf);
  if ((uVar15 & 0xf) == 0) {
    iVar9 = 0;
  }
  *(int *)((long)hal + 0x180) = iVar9;
  *(undefined4 *)((long)hal + 0x308) = 0;
  uVar2 = 0xb694;
  if (*(int *)(lVar5 + 0x28) == 1) {
    uVar2 = 0xa28f;
    uVar21 = 0x89f502dcb717366d;
  }
  else {
    uVar21 = 0x90901d50962b4c85;
  }
  *(undefined8 *)((long)hal + 900) = uVar21;
  *(undefined2 *)((long)hal + 0x38c) = uVar2;
  *(undefined1 *)((long)hal + 0x390) = 0;
  *(undefined2 *)((long)hal + 0x38e) = 0;
  MVar4 = get_vepu_fmt(&fmt_cfg,format);
  if (MVar4 != MPP_OK) {
    _mpp_log_l(2,"hal_vp8e_base","set vp8e parameter failed",(char *)0x0);
    return MPP_NOK;
  }
  *(VepuFmt *)((long)hal + 0x18c) = fmt_cfg.format;
  *(RK_U8 *)((long)hal + 0x38e) = fmt_cfg.r_mask;
  *(RK_U8 *)((long)hal + 0x38f) = fmt_cfg.g_mask;
  *(RK_U8 *)((long)hal + 0x390) = fmt_cfg.b_mask;
  iVar9 = (int)*(undefined8 *)((long)hal + 0x78);
  iVar11 = (int)((ulong)*(undefined8 *)((long)hal + 0x78) >> 0x20);
  local_68 = CONCAT44(iVar11 << 4,iVar9 << 4);
  memset((void *)((long)hal + 0x3660),0,0x188);
  for (lVar5 = 0x3674; lVar5 != 0x3754; lVar5 = lVar5 + 0x38) {
    puVar1 = (undefined8 *)((long)hal + lVar5 + -0x14);
    *puVar1 = local_68;
    puVar1[1] = CONCAT44(iVar11 * 8,iVar9 * 8);
    *(undefined8 *)((long)hal + lVar5 + -4) = 0;
  }
  *(void **)((long)hal + 0x37e8) = (void *)((long)hal + 0x3660);
  *(undefined4 *)((long)hal + 0x120) = 1;
  puVar6 = (undefined1 *)mpp_osal_calloc("set_picbuf",0x3c);
  *(undefined1 **)((long)hal + 0x118) = puVar6;
  if (puVar6 == (undefined1 *)0x0) {
    _mpp_log_l(2,"hal_vp8e_base","failed to malloc ppss store.\n",(char *)0x0);
    _mpp_log_l(2,"hal_vp8e_base","set vp8e picbuf failed, no enough memory",(char *)0x0);
    return MPP_ERR_NOMEM;
  }
  *(undefined1 **)((long)hal + 0x128) = puVar6;
  puVar6[0x18] = 0;
  *puVar6 = 0;
  group = *(MppBufferGroup **)((long)hal + 0x60);
  lVar5 = *(long *)((long)hal + 0x70);
  uVar15 = *(uint *)((long)hal + 0x6928);
  *(undefined4 *)((long)hal + 0x174) = 1;
  MVar4 = mpp_buffer_group_get
                    (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_vp8e_base","alloc_buffer");
  if (MVar4 != MPP_OK) {
    _mpp_log_l(2,"hal_vp8e_base","buf group get failed ret %d\n",(char *)0x0,(ulong)(uint)MVar4);
    if (group == (MppBufferGroup *)0x0) {
      return MVar4;
    }
    goto LAB_0025c433;
  }
  MVar4 = mpp_buffer_get_with_tag
                    (*group,group + 3,(ulong)((uVar15 * 0x100 + 0xfff & 0xfffff000) + 0x1000),
                     "hal_vp8e_base","alloc_buffer");
  if (MVar4 == MPP_OK) {
    buffer_00 = group + 4;
    for (uVar16 = 0; uVar16 != 2; uVar16 = uVar16 + 1) {
      MVar4 = mpp_buffer_get_with_tag
                        (*group,buffer_00,(ulong)((uVar15 * 0x80 + 0xfff & 0xfffff000) + 0x1000),
                         "hal_vp8e_base","alloc_buffer");
      if (MVar4 != MPP_OK) {
        _mpp_log_l(2,"hal_vp8e_base","hw_cbcr_buf[%d] get failed ret %d\n",(char *)0x0,
                   uVar16 & 0xffffffff,(ulong)(uint)MVar4);
        goto LAB_0025c433;
      }
      buffer_00 = buffer_00 + 1;
    }
    iVar9 = mpp_buffer_get_fd_with_caller(group[3],"alloc_buffer");
    *(int *)((long)hal + 0x1bc) = iVar9;
    iVar9 = mpp_buffer_get_fd_with_caller(group[4],"alloc_buffer");
    *(int *)((long)hal + 0x1c0) = iVar9;
    iVar9 = mpp_buffer_get_fd_with_caller(group[3],"alloc_buffer");
    *(int *)((long)hal + 0x1c4) = iVar9;
    iVar9 = mpp_buffer_get_fd_with_caller(group[5],"alloc_buffer");
    *(int *)((long)hal + 0x1cc) = iVar9;
    MVar4 = mpp_buffer_get_with_tag
                      (*group,group + 7,(ulong)(*(int *)(lVar5 + 0x10) * 4 + 0x17U & 0xfffffff8),
                       "hal_vp8e_base","alloc_buffer");
    if (MVar4 == MPP_OK) {
      MVar4 = mpp_buffer_get_with_tag(*group,group + 6,0x4b8,"hal_vp8e_base","alloc_buffer");
      if (MVar4 != MPP_OK) {
        pcVar12 = "hw_cabac_table_buf get failed\n";
LAB_0025c5af:
        _mpp_log_l(2,"hal_vp8e_base",pcVar12,(char *)0x0);
        goto LAB_0025c433;
      }
      iVar9 = mpp_buffer_get_fd_with_caller(group[6],"alloc_buffer");
      *(int *)((long)hal + 0x378) = iVar9;
      MVar4 = mpp_buffer_get_with_tag
                        (*group,group + 10,(ulong)(uVar15 * 4),"hal_vp8e_base","alloc_buffer");
      if (MVar4 == MPP_OK) {
        iVar9 = mpp_buffer_get_fd_with_caller(group[10],"alloc_buffer");
        *(int *)((long)hal + 0x374) = iVar9;
        pvVar7 = mpp_buffer_get_ptr_with_caller(group[10],"alloc_buffer");
        memset(pvVar7,0,(ulong)uVar15 << 2);
        mpp_buffer_sync_end_f(group[10],0,"alloc_buffer");
        MVar4 = mpp_buffer_get_with_tag(*group,group + 9,0x1e8,"hal_vp8e_base","alloc_buffer");
        if (MVar4 == MPP_OK) {
          iVar9 = mpp_buffer_get_fd_with_caller(group[9],"alloc_buffer");
          *(int *)((long)hal + 0x37c) = iVar9;
          uVar15 = uVar15 * 4 + 0x3f >> 3 & 0xfffffff8;
          buffer = group + 8;
          MVar4 = mpp_buffer_get_with_tag
                            (*group,buffer,(ulong)uVar15,"hal_vp8e_base","alloc_buffer");
          if (MVar4 == MPP_OK) {
            iVar9 = mpp_buffer_get_fd_with_caller(*buffer,"alloc_buffer");
            *(int *)((long)hal + 0x380) = iVar9;
            pvVar7 = mpp_buffer_get_ptr_with_caller(*buffer,"alloc_buffer");
            memset(pvVar7,0,(ulong)(uVar15 >> 2));
            mpp_buffer_sync_end_f(*buffer,0,"alloc_buffer");
            *(undefined4 *)((long)hal + 0x3640) = 1;
            iVar9 = mpp_buffer_get_fd_with_caller(group[3],"alloc_buffer");
            *(int *)((long)hal + 0x3670) = iVar9;
            piVar18 = (int *)((long)hal + 0x3674);
            for (lVar20 = 4; lVar20 != 6; lVar20 = lVar20 + 1) {
              iVar9 = mpp_buffer_get_fd_with_caller(group[lVar20],"alloc_buffer");
              *piVar18 = iVar9;
              piVar18 = piVar18 + 0xe;
            }
            iVar9 = (*(int *)(lVar5 + 0x10) + 0xfU & 0xffffff0) *
                    (*(int *)(lVar5 + 0xc) + 0xfU & 0xfffffff0);
            MVar4 = mpp_buffer_get_with_tag
                              (*group,group + 0xb,(ulong)((uint)((iVar9 >> 1) + iVar9) >> 1),
                               "hal_vp8e_base","alloc_buffer");
            if (MVar4 == MPP_OK) {
              pvVar7 = mpp_osal_calloc("alloc_buffer",(ulong)*(uint *)((long)hal + 0x68) << 2);
              *(void **)((long)hal + 0x58) = pvVar7;
              if (pvVar7 != (void *)0x0) {
                *(undefined8 *)((long)hal + 0x324) = 0xffffffffffffffff;
                *(undefined4 *)((long)hal + 0x32c) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x310) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x314) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x318) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x31c) = 0xffffffff;
                *(undefined8 *)((long)hal + 0x4f4) = 0;
                *(undefined8 *)((long)hal + 0x4fc) = 0x3ff;
                *(undefined4 *)((long)hal + 0x4ec) = 0;
                *(undefined8 *)((long)hal + 0x33c) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x344) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x34c) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x354) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x35c) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x364) = 0xff000000ff;
                return MPP_OK;
              }
              pcVar12 = "failed to calloc regs.\n";
              MVar4 = MPP_OK;
              goto LAB_0025c5af;
            }
            uVar16 = (ulong)(uint)MVar4;
            pcVar12 = "hw_out_buf get failed ret %d\n";
          }
          else {
            uVar16 = (ulong)(uint)MVar4;
            pcVar12 = "hw_segment_map_buf get failed ret %d\n";
          }
        }
        else {
          uVar16 = (ulong)(uint)MVar4;
          pcVar12 = "hw_prob_count_buf get failed ret %d\n";
        }
      }
      else {
        uVar16 = (ulong)(uint)MVar4;
        pcVar12 = "hw_mv_output_buf get failed ret %d\n";
      }
    }
    else {
      uVar16 = (ulong)(uint)MVar4;
      pcVar12 = "hw_size_table_buf get failed ret %d\n";
    }
  }
  else {
    uVar16 = (ulong)(uint)MVar4;
    pcVar12 = "hw_luma_buf get failed ret %d\n";
  }
  MVar4 = (MPP_RET)uVar16;
  _mpp_log_l(2,"hal_vp8e_base",pcVar12,(char *)0x0,uVar16);
LAB_0025c433:
  hal_vp8e_buf_free(hal);
  return MVar4;
}

Assistant:

MPP_RET hal_vp8e_setup(void *hal)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    if (set_parameter(ctx)) {
        mpp_err("set vp8e parameter failed");
        return MPP_NOK;
    }

    if (set_picbuf(ctx)) {
        mpp_err("set vp8e picbuf failed, no enough memory");
        return MPP_ERR_NOMEM;
    }

    ret = alloc_buffer(ctx);

    return ret;
}